

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<float,float,float,duckdb::BinaryStandardOperatorWrapper,duckdb::ModuloOperator,bool,false,true>
               (float *ldata,float *rdata,float *result_data,idx_t count,ValidityMask *mask,bool fun
               )

{
  unsigned_long *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  idx_t iVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  float fVar9;
  float fVar10;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      fVar10 = *rdata;
      iVar5 = 0;
      do {
        fVar9 = fmodf(ldata[iVar5],fVar10);
        result_data[iVar5] = fVar9;
        iVar5 = iVar5 + 1;
      } while (count != iVar5);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar6 = 0;
    uVar4 = 0;
    do {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar8 = uVar6 + 0x40;
        if (count <= uVar6 + 0x40) {
          uVar8 = count;
        }
LAB_009c4cd5:
        uVar3 = uVar6;
        if (uVar6 < uVar8) {
          fVar10 = *rdata;
          do {
            fVar9 = fmodf(ldata[uVar6],fVar10);
            result_data[uVar6] = fVar9;
            uVar6 = uVar6 + 1;
            uVar3 = uVar8;
          } while (uVar8 != uVar6);
        }
      }
      else {
        uVar2 = puVar1[uVar4];
        uVar8 = uVar6 + 0x40;
        if (count <= uVar6 + 0x40) {
          uVar8 = count;
        }
        uVar3 = uVar8;
        if (uVar2 != 0) {
          if (uVar2 == 0xffffffffffffffff) goto LAB_009c4cd5;
          uVar3 = uVar6;
          if (uVar6 < uVar8) {
            uVar7 = 0;
            do {
              if ((uVar2 >> (uVar7 & 0x3f) & 1) != 0) {
                fVar10 = fmodf(ldata[uVar6 + uVar7],*rdata);
                result_data[uVar6 + uVar7] = fVar10;
              }
              uVar7 = uVar7 + 1;
              uVar3 = uVar8;
            } while (uVar8 - uVar6 != uVar7);
          }
        }
      }
      uVar6 = uVar3;
      uVar4 = uVar4 + 1;
    } while (uVar4 != count + 0x3f >> 6);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}